

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O0

void __thiscall DFATest_ChainZip_Test::TestBody(DFATest_ChainZip_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar1;
  allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_03;
  initializer_list<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  initializer_list<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  bool bVar2;
  char *message;
  vector<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *partitions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b98;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b80;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_aa8
  ;
  vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8f0;
  AssertHelper local_8b8;
  Message local_8b0;
  allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8a8;
  less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8a7;
  undefined1 local_8a6;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a5;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_8a4;
  undefined1 local_8a3;
  allocator<char> local_8a2;
  allocator<char> local_8a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  string local_878 [32];
  iterator local_858;
  size_type local_850;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_845;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_844 [2];
  allocator<char> local_842;
  allocator<char> local_841 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  string local_818 [32];
  iterator local_7f8;
  size_type local_7f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7e5;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7e4 [2];
  allocator<char> local_7e2;
  allocator<char> local_7e1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  string local_7b8 [32];
  iterator local_798;
  size_type local_790;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_785;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_784 [2];
  allocator<char> local_782;
  allocator<char> local_781 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  string local_758 [32];
  iterator local_738;
  size_type local_730;
  undefined1 local_728 [56];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6f0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_690;
  iterator local_660;
  size_type local_658;
  set<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_650;
  SetResults local_620;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  results;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_5b8;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_580;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_548;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_510;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4d8;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4a0;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_468;
  State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_430;
  iterator local_3f8;
  size_type local_3f0;
  undefined1 local_3e8 [8];
  undefined1 local_3e0 [24];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  Graph graph;
  undefined1 local_398 [8];
  State z;
  undefined1 local_358 [8];
  State d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  iterator local_2f0;
  size_type local_2e8;
  allocator<char> local_2d9;
  undefined1 local_2d8 [8];
  State y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  iterator local_270;
  size_type local_268;
  allocator<char> local_259;
  undefined1 local_258 [8];
  State c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  iterator local_1f0;
  size_type local_1e8;
  allocator<char> local_1d9;
  undefined1 local_1d8 [8];
  State x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  iterator local_170;
  size_type local_168;
  allocator<char> local_159;
  undefined1 local_158 [8];
  State b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  iterator local_f0;
  size_type local_e8;
  allocator<char> local_d9;
  undefined1 local_d8 [8];
  State w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  iterator local_70;
  size_type local_68;
  allocator<char> local_49;
  undefined1 local_48 [8];
  State a;
  DFATest_ChainZip_Test *this_local;
  
  a.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"A",&local_49);
  w.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  w.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"B",
             (allocator<char> *)
             ((long)&w.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  w.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_70 = &local_90;
  local_68 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&w.succs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_11._M_len = local_68;
  __l_11._M_array = local_70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&a.val.field_2 + 8),__l_11,paVar1);
  w.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&w.succs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_8f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70;
  do {
    local_8f0 = local_8f0 + -1;
    std::__cxx11::string::~string((string *)local_8f0);
  } while (local_8f0 != &local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&w.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"W",&local_d9);
  b.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  b.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"X",
             (allocator<char> *)
             ((long)&b.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  b.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_f0 = &local_110;
  local_e8 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&b.succs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_10._M_len = local_e8;
  __l_10._M_array = local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&w.val.field_2 + 8),__l_10,paVar1);
  b.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&b.succs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_938 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
  do {
    local_938 = local_938 + -1;
    std::__cxx11::string::~string((string *)local_938);
  } while (local_938 != &local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&b.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_158,"B",&local_159);
  x.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  x.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"C",
             (allocator<char> *)
             ((long)&x.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  x.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_170 = &local_190;
  local_168 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&x.succs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_09._M_len = local_168;
  __l_09._M_array = local_170;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&b.val.field_2 + 8),__l_09,paVar1);
  x.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&x.succs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_980 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
  do {
    local_980 = local_980 + -1;
    std::__cxx11::string::~string((string *)local_980);
  } while (local_980 != &local_190);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&x.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1d8,"X",&local_1d9);
  c.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  c.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Y",
             (allocator<char> *)
             ((long)&c.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  c.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_1f0 = &local_210;
  local_1e8 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&c.succs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_08._M_len = local_1e8;
  __l_08._M_array = local_1f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&x.val.field_2 + 8),__l_08,paVar1);
  c.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&c.succs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_9c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0;
  do {
    local_9c8 = local_9c8 + -1;
    std::__cxx11::string::~string((string *)local_9c8);
  } while (local_9c8 != &local_210);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_258,"C",&local_259);
  y.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  y.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"D",
             (allocator<char> *)
             ((long)&y.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  y.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_270 = &local_290;
  local_268 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&y.succs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_07._M_len = local_268;
  __l_07._M_array = local_270;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&c.val.field_2 + 8),__l_07,paVar1);
  y.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&y.succs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_a10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270;
  do {
    local_a10 = local_a10 + -1;
    std::__cxx11::string::~string((string *)local_a10);
  } while (local_a10 != &local_290);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&y.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2d8,"Y",&local_2d9);
  d.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  d.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"Z",
             (allocator<char> *)
             ((long)&d.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  d.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_2f0 = &local_310;
  local_2e8 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&d.succs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_06._M_len = local_2e8;
  __l_06._M_array = local_2f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&y.val.field_2 + 8),__l_06,paVar1);
  d.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&d.succs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_a58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0;
  do {
    local_a58 = local_a58 + -1;
    std::__cxx11::string::~string((string *)local_a58);
  } while (local_a58 != &local_310);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&d.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator(&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_358,"D",
             (allocator<char> *)
             ((long)&z.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  d.val.field_2._8_8_ = 0;
  d.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  d.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&d.val.field_2 + 8));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&z.succs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"Z",
             (allocator<char> *)
             ((long)&graph.
                     super__Vector_base<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  z.val.field_2._8_8_ = 0;
  z.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  z.succs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&z.val.field_2 + 8));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&graph.
                     super__Vector_base<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  results.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_3e8 = (undefined1  [8])local_3e0;
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::State(&local_5b8,
          (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
          )local_48);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::State(&local_580,
          (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
          )local_158);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::State(&local_548,
          (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
          )local_258);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::State(&local_510,
          (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
          )local_358);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::State(&local_4d8,
          (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
          )local_d8);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::State(&local_4a0,
          (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
          )local_1d8);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::State(&local_468,
          (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
          )local_2d8);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::State(&local_430,
          (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
          )local_398);
  local_3f8 = &local_5b8;
  local_3f0 = 8;
  this_00 = (allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&results.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::
  allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(this_00);
  __l_04._M_len = local_3f0;
  __l_04._M_array = local_3f8;
  std::
  vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_3e0,__l_04,this_00);
  results.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_3c8._0_8_ = local_3e0;
  local_3c8._8_8_ = (pointer)0x1;
  this_01 = (allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&results.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::
  allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::allocator(this_01);
  __l_05._M_len = local_3c8._8_8_;
  __l_05._M_array = (iterator)local_3c8._0_8_;
  std::
  vector<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::vector((vector<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)local_3b8,__l_05,this_01);
  std::
  allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~allocator((allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)((long)&results.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_a90 = (vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3c8;
  do {
    local_a90 = local_a90 + -1;
    std::
    vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(local_a90);
  } while (local_a90 !=
           (vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_3e0);
  std::
  allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&results.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_aa8 = (State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3f8;
  do {
    local_aa8 = local_aa8 + -1;
    wasm::DFA::
    State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~State
              (local_aa8);
  } while (local_aa8 != &local_5b8);
  wasm::DFA::refinePartitions<std::__cxx11::string>
            ((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&gtest_ar.message_,(DFA *)local_3b8,partitions);
  validate((Graph *)local_3b8,(Results *)&gtest_ar.message_);
  settify(&local_620,(Results *)&gtest_ar.message_);
  local_8a6 = 1;
  local_728._0_8_ = local_728 + 8;
  local_784[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_781._1_8_ = &local_778;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"A",local_781);
  local_781._1_8_ = local_758;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"W",&local_782);
  local_784[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_738 = &local_778;
  local_730 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_785);
  __l_02._M_len = local_730;
  __l_02._M_array = local_738;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_728 + 8),__l_02,local_784,&local_785);
  local_7e4[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_7e1._1_8_ = &local_7d8;
  local_728._0_8_ = &local_6f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"B",local_7e1);
  local_7e1._1_8_ = local_7b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7b8,"X",&local_7e2);
  local_7e4[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_798 = &local_7d8;
  local_790 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_7e5);
  __l_01._M_len = local_790;
  __l_01._M_array = local_798;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_6f0,__l_01,local_7e4,&local_7e5);
  local_844[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_841._1_8_ = &local_838;
  local_728._0_8_ = &local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"C",local_841);
  local_841._1_8_ = local_818;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_818,"Y",&local_842);
  local_844[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_7f8 = &local_838;
  local_7f0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_845);
  __l_00._M_len = local_7f0;
  __l_00._M_array = local_7f8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_6c0,__l_00,local_844,&local_845);
  local_8a3 = 1;
  local_8a0 = &local_898;
  local_728._0_8_ = &local_690;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"D",&local_8a1);
  local_8a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_878;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_878,"Z",&local_8a2);
  local_8a3 = 0;
  local_858 = &local_898;
  local_850 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_8a5);
  __l._M_len = local_850;
  __l._M_array = local_858;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_690,__l,&local_8a4,&local_8a5);
  local_8a6 = 0;
  local_660 = (iterator)(local_728 + 8);
  local_658 = 4;
  std::
  allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(&local_8a8);
  __l_03._M_len = local_658;
  __l_03._M_array = local_660;
  std::
  set<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::set(&local_650,__l_03,&local_8a7,&local_8a8);
  testing::internal::EqHelper::
  Compare<std::set<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::set<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nullptr>
            ((EqHelper *)local_5f0,"settify(results)",
             "(SetResults{{\"A\", \"W\"}, {\"B\", \"X\"}, {\"C\", \"Y\"}, {\"D\", \"Z\"}})",
             &local_620,&local_650);
  std::
  set<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~set(&local_650);
  std::
  allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator(&local_8a8);
  local_b80 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_660;
  do {
    local_b80 = local_b80 + -1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(local_b80);
  } while (local_b80 !=
           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_728 + 8));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_8a5);
  local_b98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_858;
  do {
    local_b98 = local_b98 + -1;
    std::__cxx11::string::~string((string *)local_b98);
  } while (local_b98 != &local_898);
  std::allocator<char>::~allocator(&local_8a2);
  std::allocator<char>::~allocator(&local_8a1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_845);
  local_bb0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7f8;
  do {
    local_bb0 = local_bb0 + -1;
    std::__cxx11::string::~string((string *)local_bb0);
  } while (local_bb0 != &local_838);
  std::allocator<char>::~allocator(&local_842);
  std::allocator<char>::~allocator(local_841);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_7e5);
  local_bc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_798;
  do {
    local_bc8 = local_bc8 + -1;
    std::__cxx11::string::~string((string *)local_bc8);
  } while (local_bc8 != &local_7d8);
  std::allocator<char>::~allocator(&local_7e2);
  std::allocator<char>::~allocator(local_7e1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_785);
  local_be0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_738;
  do {
    local_be0 = local_be0 + -1;
    std::__cxx11::string::~string((string *)local_be0);
  } while (local_be0 != &local_778);
  std::allocator<char>::~allocator(&local_782);
  std::allocator<char>::~allocator(local_781);
  std::
  set<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~set(&local_620);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar2) {
    testing::Message::Message(&local_8b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_5f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/dfa_minimization.cpp"
               ,0x77,message);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&gtest_ar.message_);
  std::
  vector<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~vector((vector<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)local_3b8);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~State((State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_398);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~State((State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_358);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~State((State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_2d8);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~State((State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_258);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~State((State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_1d8);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~State((State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~State((State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_d8);
  wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~State((State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_48);
  return;
}

Assistant:

TEST(DFATest, ChainZip) {
  // Chain A->B->C->D is identical to chain W->X->Y->Z.
  State a{"A", {"B"}}, w{"W", {"X"}};
  State b{"B", {"C"}}, x{"X", {"Y"}};
  State c{"C", {"D"}}, y{"Y", {"Z"}};
  State d{"D", {}}, z{"Z", {}};
  Graph graph = {{a, b, c, d, w, x, y, z}};
  auto results = DFA::refinePartitions(graph);
  validate(graph, results);
  EXPECT_EQ(settify(results),
            (SetResults{{"A", "W"}, {"B", "X"}, {"C", "Y"}, {"D", "Z"}}));
}